

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O0

istream * utility::read<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (istream *stream,vector<unsigned_int,_std::allocator<unsigned_int>_> *values)

{
  size_t this;
  bool bVar1;
  istream *piVar2;
  long local_48;
  int64_t n;
  uint *value;
  iterator __end0;
  iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  size_t size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *values_local;
  istream *stream_local;
  
  __range3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  size = (size_t)values;
  values_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)stream;
  piVar2 = burst::trivial_read_fn::operator()
                     ((trivial_read_fn *)&burst::trivial_read,stream,(unsigned_long *)&__range3);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
  if (bVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)size,(size_type)__range3);
    this = size;
    __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)size);
    value = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&value), bVar1) {
      n = (int64_t)__gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&__end0);
      local_48 = 0;
      burst::trivial_read_fn::operator()
                ((trivial_read_fn *)&burst::trivial_read,(istream *)values_local,&local_48);
      *(int *)n = (int)local_48;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end0);
    }
  }
  return (istream *)values_local;
}

Assistant:

std::istream & read (std::istream & stream, Container & values)
    {
        auto size = std::size_t{};
        if (burst::trivial_read(stream, size))
        {
            values.resize(size);

            for (auto & value: values)
            {
                auto n = std::int64_t{};
                burst::trivial_read(stream, n);
                value = static_cast<typename Container::value_type>(n);
            }
        }

        return stream;
    }